

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O1

void __thiscall OpenMD::DumpWriter::writeFrameProperties(DumpWriter *this,ostream *os,Snapshot *s)

{
  undefined8 uVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  uint j;
  long lVar5;
  double (*__return_storage_ptr__) [3];
  uint j_1;
  undefined1 *puVar6;
  RealType RVar7;
  pair<double,_double> pVar9;
  Mat3x3d eta;
  Mat3x3d hmat;
  shared_ptr<OpenMD::SPFData> spfData;
  char buffer [1024];
  undefined1 local_528 [8];
  double dStack_520;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined8 local_4e8;
  double local_4d8;
  ostream *local_4d0;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined8 local_488;
  Mat3x3d local_480;
  char local_438 [1032];
  double dVar8;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"    <FrameData>\n",0x10);
  RVar7 = Snapshot::getTime(s);
  if (0x7fefffffffffffff < (ulong)ABS(RVar7)) {
    builtin_strncpy(painCave.errMsg,"DumpWriter detected a numerical error writing the time",0x37);
    painCave.isFatal = 1;
    simError();
  }
  snprintf(local_438,0x400,"        Time: %.10g\n",RVar7);
  sVar3 = strlen(local_438);
  local_4d0 = os;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_438,sVar3);
  local_498 = (undefined1  [16])0x0;
  local_4a8 = (undefined1  [16])0x0;
  local_4b8 = (undefined1  [16])0x0;
  local_4c8 = (undefined1  [16])0x0;
  local_488 = 0;
  __return_storage_ptr__ = (double (*) [3])local_528;
  Snapshot::getHmat((Mat3x3d *)__return_storage_ptr__,s);
  lVar4 = 0;
  do {
    *(undefined8 *)(local_4b8 + lVar4) = *(undefined8 *)(local_518 + lVar4);
    uVar1 = *(undefined8 *)(local_528 + lVar4 + 8);
    *(undefined8 *)(local_4c8 + lVar4) = *(undefined8 *)(local_528 + lVar4);
    *(undefined8 *)(local_4c8 + lVar4 + 8) = uVar1;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  puVar6 = local_4c8;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      if (0x7fefffffffffffff < (*(ulong *)(puVar6 + lVar5 * 8) & 0x7fffffffffffffff)) {
        builtin_strncpy(painCave.errMsg,"DumpWriter detected a numerical error writing the box",0x36
                       );
        painCave.isFatal = 1;
        simError();
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    puVar6 = puVar6 + 0x18;
  } while (lVar4 != 3);
  snprintf(local_438,0x400,
           "        Hmat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }}\n"
           ,local_4c8._0_8_,local_4b8._8_8_,local_498._0_8_,local_4c8._8_8_,local_4a8._0_8_,
           local_498._8_8_,local_4b8._0_8_,local_4a8._8_8_);
  sVar3 = strlen(local_438);
  poVar2 = local_4d0;
  std::__ostream_insert<char,std::char_traits<char>>(local_4d0,local_438,sVar3);
  pVar9 = Snapshot::getThermostat(s);
  pVar9.second = pVar9.second;
  dVar8 = pVar9.first;
  if (((0x7fefffffffffffff < (ulong)ABS(dVar8)) || (ABS(pVar9.second) == INFINITY)) ||
     (NAN(pVar9.second))) {
    builtin_strncpy(painCave.errMsg + 0x33,"hermostat",10);
    builtin_strncpy(painCave.errMsg + 0x20,"error writing the t",0x13);
    builtin_strncpy(painCave.errMsg + 0x10,"ted a numerical ",0x10);
    builtin_strncpy(painCave.errMsg,"DumpWriter detec",0x10);
    painCave.isFatal = 1;
    local_4d8 = pVar9.second;
    simError();
    pVar9.second = local_4d8;
    pVar9.first = dVar8;
  }
  snprintf(local_438,0x400,"  Thermostat: %.10g , %.10g\n",pVar9.first);
  sVar3 = strlen(local_438);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_438,sVar3);
  local_4f8 = (undefined1  [16])0x0;
  local_508 = (undefined1  [16])0x0;
  local_518 = (undefined1  [16])0x0;
  _local_528 = (undefined1  [16])0x0;
  local_4e8 = 0;
  Snapshot::getBarostat(&local_480,s);
  lVar4 = 0;
  do {
    *(undefined8 *)(local_518 + lVar4) =
         *(undefined8 *)
          ((long)local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar4 + 0x10);
    uVar1 = *(undefined8 *)
             ((long)local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0] + lVar4 + 8);
    *(undefined8 *)(local_528 + lVar4) =
         *(undefined8 *)
          ((long)local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar4);
    *(undefined8 *)(local_528 + lVar4 + 8) = uVar1;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      if (0x7fefffffffffffff <
          (ulong)ABS((((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                     super_RectMatrix<double,_3U,_3U>).data_[0][lVar5])) {
        builtin_strncpy(painCave.errMsg + 0x33,"arostat",8);
        builtin_strncpy(painCave.errMsg + 0x20,"error writing the b",0x13);
        builtin_strncpy(painCave.errMsg + 0x10,"ted a numerical ",0x10);
        builtin_strncpy(painCave.errMsg,"DumpWriter detec",0x10);
        painCave.isFatal = 1;
        simError();
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar4 != 3);
  snprintf(local_438,0x400,
           "    Barostat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }}\n"
           ,local_528,local_518._8_8_,local_4f8._0_8_,dStack_520,local_508._0_8_,local_4f8._8_8_,
           local_518._0_8_,local_508._8_8_);
  sVar3 = strlen(local_438);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_438,sVar3);
  Snapshot::getSPFData(s);
  if (((0x7fefffffffffffff <
        (*(ulong *)local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                   [0] & 0x7fffffffffffffff)) ||
      (0x7fefffffffffffff <
       (*(ulong *)((long)local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][0] + 8) & 0x7fffffffffffffff))) ||
     ((0x7fefffffffffffff <
       (*(ulong *)((long)local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][0] + 0x10) & 0x7fffffffffffffff) ||
      (0x7fefffffffffffff <
       (*(ulong *)((long)local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][0] + 0x18) & 0x7fffffffffffffff))))) {
    memcpy(&painCave,"DumpWriter detected a numerical error writing the spf data structure",0x45);
    painCave.isFatal = 1;
    simError();
  }
  snprintf(local_438,0x400,"     SPFData: {{ %.10g, %.10g, %.10g }, %.10g, %d }\n",
           *(ulong *)local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [0][0],
           *(ulong *)((long)local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                            .data_[0][0] + 8),
           *(ulong *)((long)local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                            .data_[0][0] + 0x10),
           *(ulong *)((long)local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                            .data_[0][0] + 0x18),
           (ulong)(uint)*(ulong *)((long)local_480.super_SquareMatrix<double,_3>.
                                         super_RectMatrix<double,_3U,_3U>.data_[0][0] + 0x20));
  sVar3 = strlen(local_438);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_438,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    </FrameData>\n",0x11);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_480.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1])
    ;
  }
  return;
}

Assistant:

void DumpWriter::writeFrameProperties(std::ostream& os, Snapshot* s) {
    char buffer[1024];

    os << "    <FrameData>\n";

    RealType currentTime = s->getTime();

    if (std::isinf(currentTime) || std::isnan(currentTime)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the time");
      painCave.isFatal = 1;
      simError();
    }

    snprintf(buffer, 1024, "        Time: %.10g\n", currentTime);
    os << buffer;

    Mat3x3d hmat;
    hmat = s->getHmat();

    for (unsigned int i = 0; i < 3; i++) {
      for (unsigned int j = 0; j < 3; j++) {
        if (std::isinf(hmat(i, j)) || std::isnan(hmat(i, j))) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the box");
          painCave.isFatal = 1;
          simError();
        }
      }
    }

    snprintf(
        buffer, 1024,
        "        Hmat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { "
        "%.10g, "
        "%.10g, %.10g }}\n",
        hmat(0, 0), hmat(1, 0), hmat(2, 0), hmat(0, 1), hmat(1, 1), hmat(2, 1),
        hmat(0, 2), hmat(1, 2), hmat(2, 2));
    os << buffer;

    pair<RealType, RealType> thermostat = s->getThermostat();

    if (std::isinf(thermostat.first) || std::isnan(thermostat.first) ||
        std::isinf(thermostat.second) || std::isnan(thermostat.second)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the thermostat");
      painCave.isFatal = 1;
      simError();
    }
    snprintf(buffer, 1024, "  Thermostat: %.10g , %.10g\n", thermostat.first,
             thermostat.second);
    os << buffer;

    Mat3x3d eta;
    eta = s->getBarostat();

    for (unsigned int i = 0; i < 3; i++) {
      for (unsigned int j = 0; j < 3; j++) {
        if (std::isinf(eta(i, j)) || std::isnan(eta(i, j))) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "DumpWriter detected a numerical error writing the barostat");
          painCave.isFatal = 1;
          simError();
        }
      }
    }

    snprintf(
        buffer, 1024,
        "    Barostat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { "
        "%.10g, "
        "%.10g, %.10g }}\n",
        eta(0, 0), eta(1, 0), eta(2, 0), eta(0, 1), eta(1, 1), eta(2, 1),
        eta(0, 2), eta(1, 2), eta(2, 2));
    os << buffer;

    // SPF Data
    std::shared_ptr<SPFData> spfData = s->getSPFData();

    if (std::isinf(spfData->pos[0]) || std::isnan(spfData->pos[0]) ||
        std::isinf(spfData->pos[1]) || std::isnan(spfData->pos[1]) ||
        std::isinf(spfData->pos[2]) || std::isnan(spfData->pos[2]) ||
        std::isinf(spfData->lambda) || std::isnan(spfData->lambda)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the spf data "
               "structure");
      painCave.isFatal = 1;
      simError();
    }
    snprintf(buffer, 1024,
             "     SPFData: {{ %.10g, %.10g, %.10g }, %.10g, %d }\n",
             spfData->pos[0], spfData->pos[1], spfData->pos[2], spfData->lambda,
             spfData->globalID);
    os << buffer;

    os << "    </FrameData>\n";
  }